

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O2

void set_nottype_bits(pcre2_real_code_16 *re,int cbit_type,uint table_limit)

{
  uint8_t *puVar1;
  long lVar2;
  
  puVar1 = re->tables;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    re->start_bitmap[lVar2] = re->start_bitmap[lVar2] | ~puVar1[lVar2 + (ulong)(cbit_type + 0x200)];
  }
  return;
}

Assistant:

static void
set_nottype_bits(pcre2_real_code *re, int cbit_type, unsigned int table_limit)
{
uint32_t c;
for (c = 0; c < table_limit; c++)
  re->start_bitmap[c] |= ~(re->tables[c+cbits_offset+cbit_type]);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
if (table_limit != 32) for (c = 24; c < 32; c++) re->start_bitmap[c] = 0xff;
#endif
}